

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringDictionary.cpp
# Opt level: O0

string_view __thiscall
soul::StringDictionary::getStringForHandle(StringDictionary *this,Handle handle)

{
  string_view sVar1;
  bool bVar2;
  reference this_00;
  undefined1 auVar3 [16];
  Item *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *__range1;
  StringDictionary *local_28;
  StringDictionary *this_local;
  undefined1 auStack_18 [4];
  Handle handle_local;
  char *local_10;
  
  local_28 = this;
  this_local._4_4_ = handle.handle;
  memset((void *)((long)&__range1 + 4),0,4);
  choc::value::StringDictionary::Handle::Handle((Handle *)((long)&__range1 + 4));
  bVar2 = choc::value::StringDictionary::Handle::operator==
                    ((Handle *)((long)&this_local + 4),__range1._4_4_);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  }
  else {
    __end1 = std::
             vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
             begin(&this->strings);
    s = (Item *)std::
                vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                ::end(&this->strings);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_soul::StringDictionary::Item_*,_std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>_>
                                  *)&s);
      if (!bVar2) {
        throwInternalCompilerError("getStringForHandle",0x35);
      }
      this_00 = __gnu_cxx::
                __normal_iterator<const_soul::StringDictionary::Item_*,_std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>_>
                ::operator*(&__end1);
      bVar2 = choc::value::StringDictionary::Handle::operator==(&this_00->handle,this_local._4_4_);
      if (bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_soul::StringDictionary::Item_*,_std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>_>
      ::operator++(&__end1);
    }
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this_00->text);
    local_10 = auVar3._8_8_;
    _auStack_18 = auVar3._0_8_;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = _auStack_18;
  return sVar1;
}

Assistant:

std::string_view StringDictionary::getStringForHandle (Handle handle) const
    {
        if (handle == Handle())
            return {};

        for (auto& s : strings)
            if (s.handle == handle)
                return s.text;

        SOUL_ASSERT_FALSE;
        return {};
    }